

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O3

int ur_kinematics::inverse(double *T,double *q_sols,double q6_des)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  undefined1 uVar13;
  bool bVar14;
  double *pdVar15;
  bool bVar16;
  double *pdVar17;
  bool bVar18;
  double *pdVar19;
  double *pdVar20;
  long lVar21;
  int iVar22;
  bool bVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double q5 [2] [2];
  ulong uStack_240;
  undefined4 local_238;
  uint uStack_234;
  undefined8 local_1e8;
  double local_1b8;
  double local_1a8;
  double local_188;
  double local_178;
  double local_168 [2];
  double local_158 [2];
  double local_148;
  double local_140;
  double *local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double local_58 [5];
  
  local_178 = *T;
  dVar1 = T[1];
  dVar2 = T[2];
  local_1b8 = T[3];
  local_188 = T[4];
  local_d8 = T[5];
  uStack_d0 = 0;
  local_e8 = T[6];
  uStack_e0 = 0;
  dVar3 = T[7];
  dVar27 = dVar3 - local_188 * 0.11655;
  dVar28 = local_1b8 - local_178 * 0.11655;
  dVar4 = T[8];
  local_1a8 = T[9];
  local_f8 = T[10];
  uStack_f0 = 0;
  dVar5 = T[0xb];
  local_140 = q6_des;
  if (1e-08 <= ABS(dVar27)) {
    if (1e-08 <= ABS(dVar28)) {
      dVar7 = dVar27 * dVar27 + dVar28 * dVar28;
      if (dVar7 < 0.030328222499999998) {
        return 0;
      }
      dVar7 = acos(0.17415 / SQRT(dVar7));
      dVar28 = atan2(-dVar28,dVar27);
      dVar27 = (double)(~-(ulong)(ABS(dVar7 + dVar28) < 1e-08) & (ulong)(dVar7 + dVar28));
      local_108 = (double)(~-(ulong)(ABS(dVar28 - dVar7) < 1e-08) & (ulong)(dVar28 - dVar7));
      uStack_100 = ~(CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff) &
                   CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      dVar28 = (double)(~-(ulong)(dVar27 < 0.0) & (ulong)dVar27 |
                       (ulong)(dVar27 + 6.28318530717958) & -(ulong)(dVar27 < 0.0));
      if (local_108 < 0.0) {
        local_108 = local_108 + 6.28318530717958;
      }
    }
    else {
      if (1e-08 <= ABS(0.17415 - ABS(dVar27))) {
        dVar27 = 0.17415 / dVar27;
      }
      else {
        dVar27 = (double)(int)((uint)(0.0 < dVar27) - (uint)(dVar27 < 0.0));
      }
      dVar28 = acos(dVar27);
      uStack_100 = 0;
      local_108 = 6.28318530717958 - dVar28;
    }
  }
  else {
    if (1e-08 <= ABS(0.17415 - ABS(dVar28))) {
      dVar28 = -0.17415 / dVar28;
    }
    else {
      dVar28 = (double)(int)((uint)(dVar28 < 0.0) - (uint)(0.0 < dVar28));
    }
    local_108 = asin(dVar28);
    local_108 = (double)(~-(ulong)(ABS(local_108) < 1e-08) & (ulong)local_108);
    dVar28 = (double)(~-(ulong)(local_108 < 0.0) & (ulong)local_108 |
                     (ulong)(local_108 + 6.28318530717958) & -(ulong)(local_108 < 0.0));
    uStack_100 = 0;
    local_108 = 3.14159265358979 - local_108;
  }
  local_178 = -local_178;
  local_1b8 = -local_1b8;
  local_188 = -local_188;
  local_238 = SUB84(dVar3,0);
  uStack_234 = (uint)((ulong)dVar3 >> 0x20);
  uStack_64 = uStack_234 ^ 0x80000000;
  uStack_5c = 0x80000000;
  uStack_60 = 0;
  local_68 = local_238;
  local_1a8 = -local_1a8;
  uStack_74 = local_f8._4_4_ ^ 0x80000000;
  uStack_6c = (uint)((ulong)uStack_f0 >> 0x20) ^ 0x80000000;
  uStack_70 = (undefined4)uStack_f0;
  local_78 = (undefined4)local_f8;
  pdVar17 = local_58;
  bVar14 = true;
  dVar27 = dVar28;
  do {
    bVar23 = bVar14;
    dVar7 = sin(dVar27);
    dVar27 = cos(dVar27);
    dVar27 = dVar7 * local_1b8 + dVar27 * dVar3 + -0.17415;
    if (1e-08 <= ABS(ABS(dVar27) + -0.11655)) {
      dVar27 = dVar27 / 0.11655;
    }
    else {
      dVar27 = (double)(int)((uint)(0.0 < dVar27) - (uint)(dVar27 < 0.0));
    }
    dVar27 = acos(dVar27);
    *pdVar17 = dVar27;
    pdVar17[1] = 6.28318530717958 - dVar27;
    iVar22 = 0;
    pdVar17 = local_58 + 2;
    bVar14 = false;
    dVar27 = local_108;
  } while (bVar23);
  local_88._8_4_ = 0;
  local_88._0_8_ = -dVar4;
  local_88._12_4_ = 0x80000000;
  local_a8._8_4_ = (int)uStack_e0;
  local_a8._0_8_ = -local_e8;
  local_a8._12_4_ = (uint)((ulong)uStack_e0 >> 0x20) ^ 0x80000000;
  local_98._8_4_ = (int)uStack_d0;
  local_98._0_8_ = -local_d8;
  local_98._12_4_ = (uint)((ulong)uStack_d0 >> 0x20) ^ 0x80000000;
  lVar21 = 0;
  local_1e8._0_4_ = SUB84(dVar28,0);
  local_1e8._4_4_ = (undefined4)((ulong)dVar28 >> 0x20);
  bVar14 = true;
  do {
    local_138 = local_58 + lVar21 * 2;
    lVar21 = 0;
    bVar23 = true;
    do {
      bVar18 = bVar23;
      dVar28 = cos((double)CONCAT44(local_1e8._4_4_,(undefined4)local_1e8));
      dVar27 = sin(local_1e8);
      dVar3 = local_138[lVar21];
      dVar7 = cos(dVar3);
      dVar8 = sin(dVar3);
      auVar6._8_4_ = extraout_XMM0_Dc_00;
      auVar6._0_8_ = dVar8;
      auVar6._12_4_ = extraout_XMM0_Dd_00;
      uVar24 = 0;
      uVar25 = 0;
      dVar11 = local_140;
      if (1e-08 <= ABS(dVar8)) {
        dVar11 = (double)(int)((uint)(0.0 < dVar8) - (uint)(dVar8 < 0.0));
        dVar11 = atan2(-(dVar2 * dVar27 + dVar28 * (double)local_a8._0_8_) * dVar11,
                       (dVar1 * dVar27 + dVar28 * (double)local_98._0_8_) * dVar11);
        dVar11 = (double)(~-(ulong)(ABS(dVar11) < 1e-08) & (ulong)dVar11);
        uVar10 = ~(CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) & 0x7fffffffffffffff) &
                 CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
        uVar24 = (undefined4)uVar10;
        uVar25 = (undefined4)(uVar10 >> 0x20);
        if (dVar11 < 0.0) {
          dVar11 = dVar11 + 6.28318530717958;
        }
      }
      local_b8._8_4_ = uVar24;
      local_b8._0_8_ = dVar11;
      local_b8._12_4_ = uVar25;
      dVar11 = cos(dVar11);
      dVar9 = sin((double)local_b8._0_8_);
      dVar29 = local_178 * dVar28 + dVar27 * local_188;
      dVar12 = dVar2 * dVar28 + local_e8 * dVar27;
      dVar26 = dVar1 * dVar28 + local_d8 * dVar27;
      dVar30 = dVar27 * (double)CONCAT44(uStack_64,local_68) +
               dVar28 * local_1b8 + (dVar9 * dVar26 + dVar12 * dVar11) * 0.11985 + dVar29 * -0.11655
      ;
      dVar27 = ((double)CONCAT44(uStack_74,local_78) * dVar11 + dVar9 * local_1a8) * 0.11985 +
               dVar4 * -0.11655 + dVar5 + -0.1807;
      dVar28 = (dVar30 * dVar30 + dVar27 * dVar27 + -0.37540129000000005 + -0.3266694025) /
               0.70037737;
      if (1e-08 <= ABS(ABS(dVar28) + -1.0)) {
        if (ABS(dVar28) <= 1.0) goto LAB_00115c4d;
      }
      else {
        dVar28 = (double)(int)((uint)(0.0 < dVar28) - (uint)(dVar28 < 0.0));
LAB_00115c4d:
        uStack_240 = auVar6._8_8_;
        uStack_c0 = uStack_240 ^ 0x8000000000000000;
        local_c8 = -dVar8 * dVar29 - (dVar12 * dVar9 - dVar26 * dVar11) * dVar7;
        dVar29 = (dVar11 * local_1a8 + dVar9 * local_f8) * dVar7 + dVar8 * (double)local_88._0_8_;
        dVar7 = acos(dVar28);
        dVar8 = dVar28 * 0.70037737 + 0.7020706925;
        local_158[0] = dVar7;
        local_118 = 6.28318530717958 - dVar7;
        dVar11 = sin(dVar7);
        dVar9 = dVar28 * -0.57155 + -0.6127;
        local_130 = dVar30 * dVar11 * -0.57155;
        local_128 = dVar9 * dVar27;
        dVar27 = dVar11 * -0.57155 * dVar27;
        dVar9 = dVar9 * dVar30;
        dVar28 = atan2((local_128 - local_130) / dVar8,(dVar9 + dVar27) / dVar8);
        local_148 = dVar28;
        dVar27 = atan2((local_128 + local_130) / dVar8,(dVar9 - dVar27) / dVar8);
        local_110 = dVar27;
        dVar8 = cos(dVar7 + dVar28);
        dVar28 = sin(dVar7 + dVar28);
        dVar27 = (6.28318530717958 - dVar7) + dVar27;
        dVar7 = cos(dVar27);
        dVar27 = sin(dVar27);
        local_168[0] = atan2(dVar8 * dVar29 - local_c8 * dVar28,dVar28 * dVar29 + local_c8 * dVar8);
        local_120 = atan2(dVar7 * dVar29 - local_c8 * dVar27,dVar29 * dVar27 + local_c8 * dVar7);
        pdVar15 = q_sols + (long)iVar22 * 6 + 5;
        iVar22 = iVar22 + 2;
        pdVar17 = local_158;
        pdVar19 = local_168;
        pdVar20 = &local_148;
        bVar23 = true;
        do {
          bVar16 = bVar23;
          dVar28 = *pdVar20;
          dVar27 = 0.0;
          if (ABS(dVar28) < 1e-08) {
LAB_00115f7d:
            dVar28 = dVar27;
            *pdVar20 = dVar28;
          }
          else if (dVar28 < 0.0) {
            dVar27 = dVar28 + 6.28318530717958;
            goto LAB_00115f7d;
          }
          dVar27 = *pdVar19;
          dVar7 = 0.0;
          if (ABS(dVar27) < 1e-08) {
LAB_00115faa:
            *pdVar19 = dVar7;
          }
          else {
            dVar7 = dVar27;
            if (dVar27 < 0.0) {
              dVar7 = dVar27 + 6.28318530717958;
              goto LAB_00115faa;
            }
          }
          *(undefined4 *)(pdVar15 + -5) = (undefined4)local_1e8;
          *(undefined4 *)((long)pdVar15 + -0x24) = local_1e8._4_4_;
          pdVar15[-4] = dVar28;
          pdVar15[-3] = *pdVar17;
          pdVar15[-2] = dVar7;
          pdVar15[-1] = dVar3;
          *pdVar15 = (double)local_b8._0_8_;
          pdVar15 = pdVar15 + 6;
          pdVar17 = &local_118;
          pdVar19 = &local_120;
          pdVar20 = &local_110;
          bVar23 = false;
        } while (bVar16);
      }
      lVar21 = 1;
      bVar23 = false;
    } while (bVar18);
    lVar21 = 1;
    uVar13 = !bVar14;
    local_1e8._0_4_ = (undefined4)local_108;
    local_1e8._4_4_ = local_108._4_4_;
    bVar14 = false;
    if ((bool)uVar13) {
      return iVar22;
    }
  } while( true );
}

Assistant:

int inverse(const double* T, double* q_sols, double q6_des) {
    int num_sols = 0;
    double T02 = -*T; T++; double T00 =  *T; T++; double T01 =  *T; T++; double T03 = -*T; T++;
    double T12 = -*T; T++; double T10 =  *T; T++; double T11 =  *T; T++; double T13 = -*T; T++;
    double T22 =  *T; T++; double T20 = -*T; T++; double T21 = -*T; T++; double T23 =  *T;

    ////////////////////////////// shoulder rotate joint (q1) //////////////////////////////
    double q1[2];
    {
      double A = d6*T12 - T13;
      double B = d6*T02 - T03;
      double R = A*A + B*B;
      if(fabs(A) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(B)) < ZERO_THRESH)
          div = -SIGN(d4)*SIGN(B);
        else
          div = -d4/B;
        double arcsin = asin(div);
        if(fabs(arcsin) < ZERO_THRESH)
          arcsin = 0.0;
        if(arcsin < 0.0)
          q1[0] = arcsin + 2.0*IKPI;
        else
          q1[0] = arcsin;
        q1[1] = IKPI - arcsin;
      }
      else if(fabs(B) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(A)) < ZERO_THRESH)
          div = SIGN(d4)*SIGN(A);
        else
          div = d4/A;
        double arccos = acos(div);
        q1[0] = arccos;
        q1[1] = 2.0*IKPI - arccos;
      }
      else if(d4*d4 > R) {
        return num_sols;
      }
      else {
        double arccos = acos(d4 / sqrt(R)) ;
        double arctan = atan2(-B, A);
        double pos = arccos + arctan;
        double neg = -arccos + arctan;
        if(fabs(pos) < ZERO_THRESH)
          pos = 0.0;
        if(fabs(neg) < ZERO_THRESH)
          neg = 0.0;
        if(pos >= 0.0)
          q1[0] = pos;
        else
          q1[0] = 2.0*IKPI + pos;
        if(neg >= 0.0)
          q1[1] = neg;
        else
          q1[1] = 2.0*IKPI + neg;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    ////////////////////////////// wrist 2 joint (q5) //////////////////////////////
    double q5[2][2];
    {
      for(int i=0;i<2;i++) {
        double numer = (T03*sin(q1[i]) - T13*cos(q1[i])-d4);
        double div;
        if(fabs(fabs(numer) - fabs(d6)) < ZERO_THRESH)
          div = SIGN(numer) * SIGN(d6);
        else
          div = numer / d6;
        double arccos = acos(div);
        q5[i][0] = arccos;
        q5[i][1] = 2.0*IKPI - arccos;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    {
      for(int i=0;i<2;i++) {
        for(int j=0;j<2;j++) {
          double c1 = cos(q1[i]), s1 = sin(q1[i]);
          double c5 = cos(q5[i][j]), s5 = sin(q5[i][j]);
          double q6;
          ////////////////////////////// wrist 3 joint (q6) //////////////////////////////
          if(fabs(s5) < ZERO_THRESH)
            q6 = q6_des;
          else {
            q6 = atan2(SIGN(s5)*-(T01*s1 - T11*c1),
                       SIGN(s5)*(T00*s1 - T10*c1));
            if(fabs(q6) < ZERO_THRESH)
              q6 = 0.0;
            if(q6 < 0.0)
              q6 += 2.0*IKPI;
          }
          ////////////////////////////////////////////////////////////////////////////////

          double q2[2], q3[2], q4[2];
          ///////////////////////////// RRR joints (q2,q3,q4) ////////////////////////////
          double c6 = cos(q6), s6 = sin(q6);
          double x04x = -s5*(T02*c1 + T12*s1) - c5*(s6*(T01*c1 + T11*s1) - c6*(T00*c1 + T10*s1));
          double x04y = c5*(T20*c6 - T21*s6) - T22*s5;
          double p13x = d5*(s6*(T00*c1 + T10*s1) + c6*(T01*c1 + T11*s1)) - d6*(T02*c1 + T12*s1) +
                        T03*c1 + T13*s1;
          double p13y = T23 - d1 - d6*T22 + d5*(T21*c6 + T20*s6);

          double c3 = (p13x*p13x + p13y*p13y - a2*a2 - a3*a3) / (2.0*a2*a3);
          if(fabs(fabs(c3) - 1.0) < ZERO_THRESH)
            c3 = SIGN(c3);
          else if(fabs(c3) > 1.0) {
            // TODO NO SOLUTION
            continue;
          }
          double arccos = acos(c3);
          q3[0] = arccos;
          q3[1] = 2.0*IKPI - arccos;
          double denom = a2*a2 + a3*a3 + 2*a2*a3*c3;
          double s3 = sin(arccos);
          double A = (a2 + a3*c3), B = a3*s3;
          q2[0] = atan2((A*p13y - B*p13x) / denom, (A*p13x + B*p13y) / denom);
          q2[1] = atan2((A*p13y + B*p13x) / denom, (A*p13x - B*p13y) / denom);
          double c23_0 = cos(q2[0]+q3[0]);
          double s23_0 = sin(q2[0]+q3[0]);
          double c23_1 = cos(q2[1]+q3[1]);
          double s23_1 = sin(q2[1]+q3[1]);
          q4[0] = atan2(c23_0*x04y - s23_0*x04x, x04x*c23_0 + x04y*s23_0);
          q4[1] = atan2(c23_1*x04y - s23_1*x04x, x04x*c23_1 + x04y*s23_1);
          ////////////////////////////////////////////////////////////////////////////////
          for(int k=0;k<2;k++) {
            if(fabs(q2[k]) < ZERO_THRESH)
              q2[k] = 0.0;
            else if(q2[k] < 0.0) q2[k] += 2.0*IKPI;
            if(fabs(q4[k]) < ZERO_THRESH)
              q4[k] = 0.0;
            else if(q4[k] < 0.0) q4[k] += 2.0*IKPI;
            q_sols[num_sols*6+0] = q1[i];    q_sols[num_sols*6+1] = q2[k];
            q_sols[num_sols*6+2] = q3[k];    q_sols[num_sols*6+3] = q4[k];
            q_sols[num_sols*6+4] = q5[i][j]; q_sols[num_sols*6+5] = q6;
            num_sols++;
          }

        }
      }
    }
    return num_sols;
  }